

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip6-addr.c
# Opt level: O1

int run_test_ip6_addr_link_local(void)

{
  uint ifindex;
  char *__s1;
  uv_interface_address_t *puVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *unaff_RBX;
  long lVar4;
  long lVar5;
  int count;
  size_t scoped_addr_len;
  uv_interface_address_t *addresses;
  size_t interface_id_len;
  sockaddr_in6 addr;
  char string_address [46];
  char interface_id [17];
  char scoped_addr [128];
  undefined1 auStack_160 [16];
  uv_loop_t *puStack_150;
  int local_144;
  size_t local_140;
  uv_interface_address_t *local_138;
  size_t local_130;
  sockaddr_in6 local_124;
  int local_108;
  short local_104;
  char local_d8 [32];
  char local_b8 [136];
  
  puStack_150 = (uv_loop_t *)0x15e634;
  iVar2 = uv_interface_addresses(&local_138,&local_144);
  if (iVar2 == 0) {
    if (0 < local_144) {
      lVar4 = 0x1c;
      lVar5 = 0;
      do {
        puVar1 = local_138;
        unaff_RBX = (uv_loop_t *)0x30386566;
        if (*(short *)(local_138->phys_addr + lVar4 + -0x10) == 10) {
          puStack_150 = (uv_loop_t *)0x15e686;
          iVar2 = uv_inet_ntop(10,local_138->phys_addr + lVar4 + -8,(char *)&local_108,0x2e);
          if (iVar2 == 0) {
            if (local_104 != 0x3a3a || local_108 != 0x30386566) goto LAB_0015e6a3;
            ifindex = *(uint *)(puVar1->phys_addr + lVar4 + 8);
            unaff_RBX = (uv_loop_t *)(ulong)ifindex;
            __s1 = *(char **)(puVar1->phys_addr + lVar4 + -0x24);
            local_140 = 0x80;
            puStack_150 = (uv_loop_t *)0x15e6db;
            iVar2 = uv_if_indextoname(ifindex,local_b8,&local_140);
            if (iVar2 != 0) goto LAB_0015e841;
            puStack_150 = (uv_loop_t *)0x15e6ee;
            iVar2 = strcmp(__s1,local_b8);
            if (iVar2 != 0) goto LAB_0015e846;
            local_130 = 0x11;
            puStack_150 = (uv_loop_t *)0x15e713;
            iVar2 = uv_if_indextoiid(ifindex,local_d8,&local_130);
            if (iVar2 != 0) goto LAB_0015e83c;
            puStack_150 = (uv_loop_t *)0x15e726;
            iVar2 = strcmp(__s1,local_d8);
            if (iVar2 == 0) {
              puStack_150 = (uv_loop_t *)0x15e752;
              snprintf(local_b8,0x80,"%s%%%s",&local_108,local_d8);
              puStack_150 = (uv_loop_t *)0x15e772;
              fprintf(_stderr,
                      "Testing link-local address %s (iface_index: 0x%02x, device_name: %s)\n",
                      local_b8,unaff_RBX,__s1);
              puStack_150 = (uv_loop_t *)0x15e781;
              fflush(_stderr);
              puStack_150 = (uv_loop_t *)0x15e793;
              iVar2 = uv_ip6_addr(local_b8,0x23a3,&local_124);
              if (iVar2 == 0) {
                puStack_150 = (uv_loop_t *)0x15e7b1;
                run_test_ip6_addr_link_local_cold_8();
                goto LAB_0015e6a3;
              }
              goto LAB_0015e84b;
            }
          }
          else {
            puStack_150 = (uv_loop_t *)0x15e83c;
            run_test_ip6_addr_link_local_cold_2();
LAB_0015e83c:
            puStack_150 = (uv_loop_t *)0x15e841;
            run_test_ip6_addr_link_local_cold_5();
LAB_0015e841:
            puStack_150 = (uv_loop_t *)0x15e846;
            run_test_ip6_addr_link_local_cold_3();
LAB_0015e846:
            puStack_150 = (uv_loop_t *)0x15e84b;
            run_test_ip6_addr_link_local_cold_4();
LAB_0015e84b:
            puStack_150 = (uv_loop_t *)0x15e853;
            run_test_ip6_addr_link_local_cold_7();
          }
          puStack_150 = (uv_loop_t *)0x15e858;
          run_test_ip6_addr_link_local_cold_6();
          goto LAB_0015e858;
        }
LAB_0015e6a3:
        unaff_RBX = (uv_loop_t *)0x30386566;
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x50;
      } while (lVar5 < local_144);
    }
    puStack_150 = (uv_loop_t *)0x15e7cd;
    uv_free_interface_addresses(local_138,local_144);
    local_140 = 0x80;
    puStack_150 = (uv_loop_t *)0x15e7eb;
    iVar2 = uv_if_indextoname(0xffffffff,local_b8,&local_140);
    if (iVar2 == 0) goto LAB_0015e85d;
    puStack_150 = (uv_loop_t *)0x15e7f4;
    unaff_RBX = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x15e808;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_150 = (uv_loop_t *)0x15e812;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_150 = (uv_loop_t *)0x15e817;
    puVar3 = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x15e81f;
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
LAB_0015e858:
    puStack_150 = (uv_loop_t *)0x15e85d;
    run_test_ip6_addr_link_local_cold_1();
LAB_0015e85d:
    puStack_150 = (uv_loop_t *)0x15e862;
    run_test_ip6_addr_link_local_cold_10();
  }
  puStack_150 = (uv_loop_t *)run_test_ip6_pton;
  run_test_ip6_addr_link_local_cold_9();
  puVar3 = (uv_loop_t *)0xa;
  puStack_150 = unaff_RBX;
  iVar2 = uv_inet_pton(10,"::",auStack_160);
  if (iVar2 == 0) {
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"::%en1",auStack_160);
    if (iVar2 != 0) goto LAB_0015eed1;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"::%%%%",auStack_160);
    if (iVar2 != 0) goto LAB_0015eed6;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"::%en1:1.2.3.4",auStack_160);
    if (iVar2 != 0) goto LAB_0015eedb;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"::1",auStack_160);
    if (iVar2 != 0) goto LAB_0015eee0;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"::1%en1",auStack_160);
    if (iVar2 != 0) goto LAB_0015eee5;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"::1%%%%",auStack_160);
    if (iVar2 != 0) goto LAB_0015eeea;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"::1%en1:1.2.3.4",auStack_160);
    if (iVar2 != 0) goto LAB_0015eeef;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::1",auStack_160);
    if (iVar2 != 0) goto LAB_0015eef4;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::1%en1",auStack_160);
    if (iVar2 != 0) goto LAB_0015eef9;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::1%%%%",auStack_160);
    if (iVar2 != 0) goto LAB_0015eefe;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::1%en1:1.2.3.4",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef03;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef08;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::%en1",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef0d;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::%%%%",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef12;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::%en1:1.2.3.4",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef17;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef1c;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%en1",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef21;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%%%%",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef26;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%en1:1.2.3.4",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef2b;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef30;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%en1",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef35;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%%%%",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef3a;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%en1:1.2.3.4",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef3f;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef44;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%en1",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef49;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%%%%",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef4e;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%en1:1.2.3.4",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef53;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef58;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef5d;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%%%%",auStack_160);
    if (iVar2 != 0) goto LAB_0015ef62;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1:1.2.3.4",auStack_160)
    ;
    if (iVar2 != 0) goto LAB_0015ef67;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,":::1",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef6c;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,":::1%en1",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef71;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,":::1%%%%",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef76;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,":::1%en1:1.2.3.4",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef7b;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"abcde::1",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef80;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"abcde::1%en1",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef85;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"abcde::1%%%%",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef8a;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"abcde::1%en1:1.2.3.4",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef8f;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef94;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%en1",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef99;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%%%%",auStack_160);
    if (iVar2 == 0) goto LAB_0015ef9e;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%en1:1.2.3.4",auStack_160);
    if (iVar2 == 0) goto LAB_0015efa3;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4",auStack_160);
    if (iVar2 == 0) goto LAB_0015efa8;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1",auStack_160);
    if (iVar2 == 0) goto LAB_0015efad;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%%%%",auStack_160);
    if (iVar2 == 0) goto LAB_0015efb2;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1:1.2.3.4",auStack_160);
    if (iVar2 == 0) goto LAB_0015efb7;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5",auStack_160);
    if (iVar2 == 0) goto LAB_0015efbc;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%en1",auStack_160);
    if (iVar2 == 0) goto LAB_0015efc1;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%%%%",auStack_160);
    if (iVar2 == 0) goto LAB_0015efc6;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%en1:1.2.3.4",auStack_160);
    if (iVar2 == 0) goto LAB_0015efcb;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255",auStack_160);
    if (iVar2 == 0) goto LAB_0015efd0;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1",auStack_160);
    if (iVar2 == 0) goto LAB_0015efd5;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%%%%",auStack_160);
    if (iVar2 == 0) goto LAB_0015efda;
    puVar3 = (uv_loop_t *)0xa;
    iVar2 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1:1.2.3.4",
                         auStack_160);
    if (iVar2 != 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0015efe4;
    }
  }
  else {
    run_test_ip6_pton_cold_1();
LAB_0015eed1:
    run_test_ip6_pton_cold_2();
LAB_0015eed6:
    run_test_ip6_pton_cold_3();
LAB_0015eedb:
    run_test_ip6_pton_cold_4();
LAB_0015eee0:
    run_test_ip6_pton_cold_5();
LAB_0015eee5:
    run_test_ip6_pton_cold_6();
LAB_0015eeea:
    run_test_ip6_pton_cold_7();
LAB_0015eeef:
    run_test_ip6_pton_cold_8();
LAB_0015eef4:
    run_test_ip6_pton_cold_9();
LAB_0015eef9:
    run_test_ip6_pton_cold_10();
LAB_0015eefe:
    run_test_ip6_pton_cold_11();
LAB_0015ef03:
    run_test_ip6_pton_cold_12();
LAB_0015ef08:
    run_test_ip6_pton_cold_13();
LAB_0015ef0d:
    run_test_ip6_pton_cold_14();
LAB_0015ef12:
    run_test_ip6_pton_cold_15();
LAB_0015ef17:
    run_test_ip6_pton_cold_16();
LAB_0015ef1c:
    run_test_ip6_pton_cold_17();
LAB_0015ef21:
    run_test_ip6_pton_cold_18();
LAB_0015ef26:
    run_test_ip6_pton_cold_19();
LAB_0015ef2b:
    run_test_ip6_pton_cold_20();
LAB_0015ef30:
    run_test_ip6_pton_cold_21();
LAB_0015ef35:
    run_test_ip6_pton_cold_22();
LAB_0015ef3a:
    run_test_ip6_pton_cold_23();
LAB_0015ef3f:
    run_test_ip6_pton_cold_24();
LAB_0015ef44:
    run_test_ip6_pton_cold_25();
LAB_0015ef49:
    run_test_ip6_pton_cold_26();
LAB_0015ef4e:
    run_test_ip6_pton_cold_27();
LAB_0015ef53:
    run_test_ip6_pton_cold_28();
LAB_0015ef58:
    run_test_ip6_pton_cold_29();
LAB_0015ef5d:
    run_test_ip6_pton_cold_30();
LAB_0015ef62:
    run_test_ip6_pton_cold_31();
LAB_0015ef67:
    run_test_ip6_pton_cold_32();
LAB_0015ef6c:
    run_test_ip6_pton_cold_57();
LAB_0015ef71:
    run_test_ip6_pton_cold_56();
LAB_0015ef76:
    run_test_ip6_pton_cold_55();
LAB_0015ef7b:
    run_test_ip6_pton_cold_54();
LAB_0015ef80:
    run_test_ip6_pton_cold_53();
LAB_0015ef85:
    run_test_ip6_pton_cold_52();
LAB_0015ef8a:
    run_test_ip6_pton_cold_51();
LAB_0015ef8f:
    run_test_ip6_pton_cold_50();
LAB_0015ef94:
    run_test_ip6_pton_cold_49();
LAB_0015ef99:
    run_test_ip6_pton_cold_48();
LAB_0015ef9e:
    run_test_ip6_pton_cold_47();
LAB_0015efa3:
    run_test_ip6_pton_cold_46();
LAB_0015efa8:
    run_test_ip6_pton_cold_45();
LAB_0015efad:
    run_test_ip6_pton_cold_44();
LAB_0015efb2:
    run_test_ip6_pton_cold_43();
LAB_0015efb7:
    run_test_ip6_pton_cold_42();
LAB_0015efbc:
    run_test_ip6_pton_cold_41();
LAB_0015efc1:
    run_test_ip6_pton_cold_40();
LAB_0015efc6:
    run_test_ip6_pton_cold_39();
LAB_0015efcb:
    run_test_ip6_pton_cold_38();
LAB_0015efd0:
    run_test_ip6_pton_cold_37();
LAB_0015efd5:
    run_test_ip6_pton_cold_36();
LAB_0015efda:
    run_test_ip6_pton_cold_35();
  }
  run_test_ip6_pton_cold_34();
LAB_0015efe4:
  run_test_ip6_pton_cold_33();
  iVar2 = uv_is_closing((uv_handle_t *)puVar3);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(ip6_addr_link_local) {
#if defined(__CYGWIN__) || defined(__MSYS__)
  /* FIXME: Does Cygwin support this?  */
  RETURN_SKIP("FIXME: This test needs more investigation on Cygwin");
#endif
  char string_address[INET6_ADDRSTRLEN];
  uv_interface_address_t* addresses;
  uv_interface_address_t* address;
  struct sockaddr_in6 addr;
  unsigned int iface_index;
  const char* device_name;
  /* 40 bytes address, 16 bytes device name, plus reserve. */
  char scoped_addr[128];
  size_t scoped_addr_len;
  char interface_id[UV_IF_NAMESIZE];
  size_t interface_id_len;
  int count;
  int ix;
  int r;

  ASSERT(0 == uv_interface_addresses(&addresses, &count));

  for (ix = 0; ix < count; ix++) {
    address = addresses + ix;

    if (address->address.address6.sin6_family != AF_INET6)
      continue;

    ASSERT(0 == uv_inet_ntop(AF_INET6,
                             &address->address.address6.sin6_addr,
                             string_address,
                             sizeof(string_address)));

    /* Skip addresses that are not link-local. */
    if (strncmp(string_address, "fe80::", 6) != 0)
      continue;

    iface_index = address->address.address6.sin6_scope_id;
    device_name = address->name;

    scoped_addr_len = sizeof(scoped_addr);
    ASSERT(0 == uv_if_indextoname(iface_index, scoped_addr, &scoped_addr_len));
#ifndef _WIN32
    /* This assert fails on Windows, as Windows semantics are different. */
    ASSERT(0 == strcmp(device_name, scoped_addr));
#endif

    interface_id_len = sizeof(interface_id);
    r = uv_if_indextoiid(iface_index, interface_id, &interface_id_len);
    ASSERT(0 == r);
#ifdef _WIN32
    /* On Windows, the interface identifier is the numeric string of the index. */
    ASSERT(strtoul(interface_id, NULL, 10) == iface_index);
#else
    /* On Unix/Linux, the interface identifier is the interface device name. */
    ASSERT(0 == strcmp(device_name, interface_id));
#endif

    snprintf(scoped_addr,
             sizeof(scoped_addr),
             "%s%%%s",
             string_address,
             interface_id);

    fprintf(stderr, "Testing link-local address %s "
            "(iface_index: 0x%02x, device_name: %s)\n",
            scoped_addr,
            iface_index,
            device_name);
    fflush(stderr);

    ASSERT(0 == uv_ip6_addr(scoped_addr, TEST_PORT, &addr));
    fprintf(stderr, "Got scope_id 0x%02x\n", addr.sin6_scope_id);
    fflush(stderr);
    ASSERT(iface_index == addr.sin6_scope_id);
  }

  uv_free_interface_addresses(addresses, count);

  scoped_addr_len = sizeof(scoped_addr);
  ASSERT(0 != uv_if_indextoname((unsigned int)-1, scoped_addr, &scoped_addr_len));

  MAKE_VALGRIND_HAPPY();
  return 0;
}